

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

void __thiscall IDisk::IDisk(IDisk *this,DiskType diskType)

{
  MFMTrack *pMVar1;
  uchar *track_buffer;
  long lVar2;
  uint track;
  ulong uVar3;
  
  IDisk(this);
  this->nb_sides_ = '\x01';
  this->side_[0].nb_tracks = 0x2a;
  pMVar1 = (MFMTrack *)operator_new__(0x540);
  this->side_[0].tracks = pMVar1;
  lVar2 = 0x18;
  uVar3 = 0;
  do {
    pMVar1 = this->side_[0].tracks;
    *(undefined4 *)((long)pMVar1 + lVar2 + -0x10) = 0;
    *(undefined8 *)((long)pMVar1 + lVar2 + -0x18) = 0;
    *(undefined4 *)((long)&pMVar1->revolution + lVar2) = 100000;
    track_buffer = (uchar *)operator_new__(100000);
    *(uchar **)((long)pMVar1 + lVar2 + -8) = track_buffer;
    FillTrack(track_buffer,(uchar)uVar3,diskType,*(uint *)((long)&pMVar1->revolution + lVar2));
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x20;
  } while (uVar3 < this->side_[0].nb_tracks);
  return;
}

Assistant:

IDisk::IDisk(IDisk::DiskType diskType) : IDisk()
{
   // BLANK DISK :
   // One side
   nb_sides_ = 1;

   // 41 tracks
   side_[0].nb_tracks = 42;
   side_[0].tracks = new MFMTrack[side_[0].nb_tracks];
   for (unsigned int track = 0; track < side_[0].nb_tracks; track++)
   {
      // One revolution
      side_[0].tracks[track].nb_revolutions = 0;
      side_[0].tracks[track].revolution = nullptr; //new tRevolution[1];

      side_[0].tracks[track].size = 6250 * 16;
      side_[0].tracks[track].bitfield = new unsigned char[side_[0].tracks[track].size];

      // Fill each track
      FillTrack(side_[0].tracks[track].bitfield, track, diskType, side_[0].tracks[track].size);
   }
}